

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_takeNonExistentReset_Test::~Reset_takeNonExistentReset_Test
          (Reset_takeNonExistentReset_Test *this)

{
  Reset_takeNonExistentReset_Test *this_local;
  
  ~Reset_takeNonExistentReset_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, takeNonExistentReset)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Add r to c.
    EXPECT_TRUE(c->addReset(r));
    EXPECT_EQ(size_t(1), c->resetCount());

    // Retrieve a non-existent reset from c.
    auto taken_r = c->takeReset(1);
    EXPECT_EQ(nullptr, taken_r);
    EXPECT_EQ(size_t(1), c->resetCount());
}